

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Inst::PrintBytes<UnifiedRegex::SwitchMixin<(unsigned_char)16>>
          (Inst *this,DebugWriter *w,Inst *inst,SwitchMixin<(unsigned_char)__x10_> *that,
          char16 *annotation)

{
  ulong uVar1;
  
  DebugWriter::Print(w,L"0x%p[+0x%03x](0x%03x) [%s]:",that,(long)that - (long)inst,0x61,annotation);
  if (that < that + 1) {
    uVar1 = 0xffffffffffffff9f;
    do {
      if ((uVar1 & 3) == 0) {
        DebugWriter::Print(w,L" ",(ulong)*(byte *)((long)that[1].cases + (uVar1 - 1)));
      }
      DebugWriter::Print(w,L"%02x",(ulong)*(byte *)((long)that[1].cases + (uVar1 - 1)));
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0);
  }
  DebugWriter::PrintEOL(w,L"");
  return;
}

Assistant:

void Inst::PrintBytes(DebugWriter *w, Inst *inst, T *that, const char16 *annotation) const
    {
        T *start = (T*)that;
        byte *startByte = (byte *)start;
        byte *baseByte = (byte *)inst;
        ptrdiff_t offset = startByte - baseByte;
        size_t size = sizeof(*((T *)that));
        byte *endByte = startByte + size;
        byte *currentByte = startByte;
        w->Print(_u("0x%p[+0x%03x](0x%03x) [%s]:"), startByte, offset, size, annotation);

        for (; currentByte < endByte; ++currentByte)
        {
            if ((currentByte - endByte) % 4 == 0)
            {
                w->Print(_u(" "), *currentByte);
            }
            w->Print(_u("%02x"), *currentByte);
        }
        w->PrintEOL(_u(""));
    }